

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O3

void __thiscall idx2::free_list_allocator::Dealloc(free_list_allocator *this,buffer *Buf)

{
  node *pnVar1;
  
  if ((this->MinBytes <= Buf->Bytes) && (Buf->Bytes <= this->MaxBytes)) {
    Buf->Bytes = 0;
    Buf->Alloc = &this->super_allocator;
    pnVar1 = (node *)Buf->Data;
    pnVar1->Next = this->Head;
    this->Head = pnVar1;
    return;
  }
  (*this->Parent->_vptr_allocator[1])();
  return;
}

Assistant:

void
free_list_allocator::Dealloc(buffer* Buf)
{
  idx2_Assert(Parent);
  if (MinBytes <= Buf->Bytes && Buf->Bytes <= MaxBytes)
  {
    Buf->Bytes = 0;
    Buf->Alloc = this;
    node* P = (node*)(Buf->Data);
    P->Next = Head;
    Head = P;
  }
  else
  {
    Parent->Dealloc(Buf);
  }
}